

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm.cpp
# Opt level: O2

void __thiscall wasm::Module::removeGlobals(Module *this,function<bool_(wasm::Global_*)> *pred)

{
  function<bool_(wasm::Global_*)> local_40;
  
  std::function<bool_(wasm::Global_*)>::function(&local_40,pred);
  removeModuleElements<std::vector<std::unique_ptr<wasm::Global,std::default_delete<wasm::Global>>,std::allocator<std::unique_ptr<wasm::Global,std::default_delete<wasm::Global>>>>,std::unordered_map<wasm::Name,wasm::Global*,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,wasm::Global*>>>,wasm::Global>
            (&this->globals,&this->globalsMap,&local_40);
  std::_Function_base::~_Function_base(&local_40.super__Function_base);
  return;
}

Assistant:

void Module::removeGlobals(std::function<bool(Global*)> pred) {
  removeModuleElements(globals, globalsMap, pred);
}